

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O2

IterateResult __thiscall gl4cts::GPUShaderFP64Test6::iterate(GPUShaderFP64Test6 *this)

{
  bool bVar1;
  NotSupportedError *this_00;
  char *description;
  _test_case *test_case;
  long lVar2;
  allocator<char> local_2354;
  allocator<char> local_2353;
  allocator<char> local_2352;
  allocator<char> local_2351;
  allocator<char> local_2350;
  allocator<char> local_234f;
  allocator<char> local_234e;
  allocator<char> local_234d;
  allocator<char> local_234c;
  allocator<char> local_234b;
  allocator<char> local_234a;
  allocator<char> local_2349;
  allocator<char> local_2348;
  allocator<char> local_2347;
  allocator<char> local_2346;
  allocator<char> local_2345;
  allocator<char> local_2344;
  allocator<char> local_2343;
  allocator<char> local_2342;
  allocator<char> local_2341;
  allocator<char> local_2340;
  allocator<char> local_233f;
  allocator<char> local_233e;
  allocator<char> local_233d;
  allocator<char> local_233c;
  allocator<char> local_233b;
  allocator<char> local_233a;
  allocator<char> local_2339;
  allocator<char> local_2338;
  allocator<char> local_2337;
  allocator<char> local_2336;
  allocator<char> local_2335;
  allocator<char> local_2334;
  allocator<char> local_2333;
  allocator<char> local_2332;
  allocator<char> local_2331;
  allocator<char> local_2330;
  allocator<char> local_232f;
  allocator<char> local_232e;
  allocator<char> local_232d;
  allocator<char> local_232c;
  allocator<char> local_232b;
  allocator<char> local_232a;
  allocator<char> local_2329;
  allocator<char> local_2328;
  allocator<char> local_2327;
  allocator<char> local_2326;
  allocator<char> local_2325;
  allocator<char> local_2324;
  allocator<char> local_2323;
  allocator<char> local_2322;
  allocator<char> local_2321;
  allocator<char> local_2320;
  allocator<char> local_231f;
  allocator<char> local_231e;
  allocator<char> local_231d;
  allocator<char> local_231c;
  allocator<char> local_231b;
  allocator<char> local_231a;
  allocator<char> local_2319;
  allocator<char> local_2318;
  allocator<char> local_2317;
  allocator<char> local_2316;
  allocator<char> local_2315;
  allocator<char> local_2314;
  allocator<char> local_2313;
  allocator<char> local_2312;
  allocator<char> local_2311;
  allocator<char> local_2310;
  allocator<char> local_230f;
  allocator<char> local_230e;
  allocator<char> local_230d;
  allocator<char> local_230c;
  allocator<char> local_230b;
  allocator<char> local_230a;
  allocator<char> local_2309;
  allocator<char> local_2308;
  allocator<char> local_2307;
  allocator<char> local_2306;
  allocator<char> local_2305;
  allocator<char> local_2304;
  allocator<char> local_2303;
  allocator<char> local_2302;
  allocator<char> local_2301;
  allocator<char> local_2300;
  allocator<char> local_22ff;
  allocator<char> local_22fe;
  allocator<char> local_22fd;
  allocator<char> local_22fc;
  allocator<char> local_22fb;
  allocator<char> local_22fa;
  allocator<char> local_22f9;
  allocator<char> local_22f8;
  allocator<char> local_22f7;
  allocator<char> local_22f6;
  allocator<char> local_22f5;
  allocator<char> local_22f4;
  allocator<char> local_22f3;
  allocator<char> local_22f2;
  allocator<char> local_22f1;
  allocator<char> local_22f0;
  allocator<char> local_22ef;
  allocator<char> local_22ee;
  allocator<char> local_22ed;
  allocator<char> local_22ec;
  allocator<char> local_22eb;
  allocator<char> local_22ea;
  allocator<char> local_22e9;
  allocator<char> local_22e8;
  allocator<char> local_22e7;
  allocator<char> local_22e6;
  allocator<char> local_22e5;
  allocator<char> local_22e4;
  allocator<char> local_22e3;
  allocator<char> local_22e2;
  allocator<char> local_22e1;
  allocator<char> local_22e0;
  allocator<char> local_22df;
  allocator<char> local_22de;
  allocator<char> local_22dd;
  allocator<char> local_22dc;
  allocator<char> local_22db;
  allocator<char> local_22da;
  allocator<char> local_22d9;
  allocator<char> local_22d8;
  allocator<char> local_22d7;
  allocator<char> local_22d6;
  allocator<char> local_22d5;
  allocator<char> local_22d4;
  allocator<char> local_22d3;
  allocator<char> local_22d2;
  allocator<char> local_22d1;
  allocator<char> local_22d0;
  allocator<char> local_22cf;
  allocator<char> local_22ce;
  allocator<char> local_22cd;
  allocator<char> local_22cc;
  allocator<char> local_22cb;
  allocator<char> local_22ca;
  allocator<char> local_22c9;
  allocator<char> local_22c8;
  allocator<char> local_22c7;
  allocator<char> local_22c6;
  allocator<char> local_22c5;
  allocator<char> local_22c4;
  allocator<char> local_22c3;
  allocator<char> local_22c2;
  allocator<char> local_22c1;
  allocator<char> local_22c0;
  allocator<char> local_22bf;
  allocator<char> local_22be;
  allocator<char> local_22bd;
  allocator<char> local_22bc;
  allocator<char> local_22bb;
  allocator<char> local_22ba;
  allocator<char> local_22b9;
  allocator<char> local_22b8;
  allocator<char> local_22b7;
  allocator<char> local_22b6;
  allocator<char> local_22b5;
  allocator<char> local_22b4;
  allocator<char> local_22b3;
  allocator<char> local_22b2;
  allocator<char> local_22b1;
  allocator<char> local_22b0;
  allocator<char> local_22af;
  allocator<char> local_22ae;
  allocator<char> local_22ad;
  allocator<char> local_22ac;
  allocator<char> local_22ab;
  allocator<char> local_22aa;
  allocator<char> local_22a9;
  allocator<char> local_22a8;
  allocator<char> local_22a7;
  allocator<char> local_22a6;
  allocator<char> local_22a5;
  allocator<char> local_22a4;
  allocator<char> local_22a3;
  allocator<char> local_22a2;
  allocator<char> local_22a1;
  allocator<char> local_22a0;
  allocator<char> local_229f;
  allocator<char> local_229e;
  allocator<char> local_229d;
  allocator<char> local_229c;
  allocator<char> local_229b;
  allocator<char> local_229a;
  allocator<char> local_2299;
  allocator<char> local_2298;
  allocator<char> local_2297;
  allocator<char> local_2296;
  allocator<char> local_2295;
  allocator<char> local_2294;
  allocator<char> local_2293;
  allocator<char> local_2292;
  allocator<char> local_2291;
  allocator<char> local_2290;
  allocator<char> local_228f;
  allocator<char> local_228e;
  allocator<char> local_228d;
  allocator<char> local_228c;
  allocator<char> local_228b;
  allocator<char> local_228a;
  allocator<char> local_2289;
  allocator<char> local_2288;
  allocator<char> local_2287;
  allocator<char> local_2286;
  allocator<char> local_2285;
  allocator<char> local_2284;
  allocator<char> local_2283;
  allocator<char> local_2282;
  allocator<char> local_2281;
  allocator<char> local_2280;
  allocator<char> local_227f;
  allocator<char> local_227e;
  allocator<char> local_227d;
  allocator<char> local_227c;
  allocator<char> local_227b;
  allocator<char> local_227a;
  allocator<char> local_2279;
  allocator<char> local_2278;
  allocator<char> local_2277;
  allocator<char> local_2276;
  allocator<char> local_2275;
  allocator<char> local_2274;
  allocator<char> local_2273;
  allocator<char> local_2272;
  allocator<char> local_2271;
  allocator<char> local_2270;
  allocator<char> local_226f;
  allocator<char> local_226e;
  allocator<char> local_226d;
  allocator<char> local_226c;
  allocator<char> local_226b;
  allocator<char> local_226a;
  allocator<char> local_2269;
  allocator<char> local_2268;
  allocator<char> local_2267;
  allocator<char> local_2266;
  allocator<char> local_2265;
  allocator<char> local_2264;
  allocator<char> local_2263;
  allocator<char> local_2262;
  allocator<char> local_2261;
  allocator<char> local_2260;
  allocator<char> local_225f;
  allocator<char> local_225e;
  allocator<char> local_225d;
  allocator<char> local_225c;
  allocator<char> local_225b;
  allocator<char> local_225a;
  allocator<char> local_2259;
  _test_case test_cases [42];
  
  bVar1 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_gpu_shader_fp64");
  if (bVar1) {
    initTest(this);
    test_cases[0].src_array_size = 2;
    test_cases[0].src_type = VARIABLE_TYPE_INT;
    test_cases[0].dst_type = VARIABLE_TYPE_DOUBLE;
    test_cases[0].wrap_dst_type_in_structure = false;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0].cs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_2354);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0].fs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_2259);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0].gs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_225a);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0].tc_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_225b);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0].te_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_225c);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0].vs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_225d);
    test_cases[1].src_array_size = 2;
    test_cases[1].src_type = VARIABLE_TYPE_INT;
    test_cases[1].dst_type = VARIABLE_TYPE_DOUBLE;
    test_cases[1].wrap_dst_type_in_structure = true;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[1].cs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_225e);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[1].fs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_225f);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[1].gs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_2260);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[1].tc_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_2261);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[1].te_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_2262);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[1].vs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_2263);
    test_cases[2].src_array_size = 2;
    test_cases[2].src_type = VARIABLE_TYPE_IVEC2;
    test_cases[2].dst_type = VARIABLE_TYPE_DVEC2;
    test_cases[2].wrap_dst_type_in_structure = false;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[2].cs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_2264);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[2].fs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_2265);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[2].gs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_2266);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[2].tc_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_2267);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[2].te_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_2268);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[2].vs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_2269);
    test_cases[3].src_array_size = 2;
    test_cases[3].src_type = VARIABLE_TYPE_IVEC2;
    test_cases[3].dst_type = VARIABLE_TYPE_DVEC2;
    test_cases[3].wrap_dst_type_in_structure = true;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[3].cs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_226a);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[3].fs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_226b);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[3].gs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_226c);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[3].tc_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_226d);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[3].te_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_226e);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[3].vs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_226f);
    test_cases[4].src_array_size = 2;
    test_cases[4].src_type = VARIABLE_TYPE_IVEC3;
    test_cases[4].dst_type = VARIABLE_TYPE_DVEC3;
    test_cases[4].wrap_dst_type_in_structure = false;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[4].cs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_2270);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[4].fs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_2271);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[4].gs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_2272);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[4].tc_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_2273);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[4].te_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_2274);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[4].vs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_2275);
    test_cases[5].src_array_size = 2;
    test_cases[5].src_type = VARIABLE_TYPE_IVEC3;
    test_cases[5].dst_type = VARIABLE_TYPE_DVEC3;
    test_cases[5].wrap_dst_type_in_structure = true;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[5].cs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_2276);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[5].fs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_2277);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[5].gs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_2278);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[5].tc_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_2279);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[5].te_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_227a);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[5].vs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_227b);
    test_cases[6].src_array_size = 2;
    test_cases[6].src_type = VARIABLE_TYPE_IVEC4;
    test_cases[6].dst_type = VARIABLE_TYPE_DVEC4;
    test_cases[6].wrap_dst_type_in_structure = false;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[6].cs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_227c);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[6].fs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_227d);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[6].gs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_227e);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[6].tc_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_227f);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[6].te_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_2280);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[6].vs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_2281);
    test_cases[7].src_array_size = 2;
    test_cases[7].src_type = VARIABLE_TYPE_IVEC4;
    test_cases[7].dst_type = VARIABLE_TYPE_DVEC4;
    test_cases[7].wrap_dst_type_in_structure = true;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[7].cs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_2282);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[7].fs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_2283);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[7].gs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_2284);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[7].tc_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_2285);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[7].te_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_2286);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[7].vs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_2287);
    test_cases[8].src_array_size = 2;
    test_cases[8].src_type = VARIABLE_TYPE_UINT;
    test_cases[8].dst_type = VARIABLE_TYPE_DOUBLE;
    test_cases[8].wrap_dst_type_in_structure = false;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[8].cs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_2288);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[8].fs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_2289);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[8].gs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_228a);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[8].tc_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_228b);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[8].te_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_228c);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[8].vs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_228d);
    test_cases[9].src_array_size = 2;
    test_cases[9].src_type = VARIABLE_TYPE_UINT;
    test_cases[9].dst_type = VARIABLE_TYPE_DOUBLE;
    test_cases[9].wrap_dst_type_in_structure = true;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[9].cs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_228e);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[9].fs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_228f);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[9].gs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_2290);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[9].tc_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_2291);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[9].te_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_2292);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[9].vs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_2293);
    test_cases[10].src_array_size = 2;
    test_cases[10].src_type = VARIABLE_TYPE_UVEC2;
    test_cases[10].dst_type = VARIABLE_TYPE_DVEC2;
    test_cases[10].wrap_dst_type_in_structure = false;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[10].cs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_2294);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[10].fs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_2295);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[10].gs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_2296);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[10].tc_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_2297);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[10].te_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_2298);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[10].vs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_2299);
    test_cases[0xb].src_array_size = 2;
    test_cases[0xb].src_type = VARIABLE_TYPE_UVEC2;
    test_cases[0xb].dst_type = VARIABLE_TYPE_DVEC2;
    test_cases[0xb].wrap_dst_type_in_structure = true;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0xb].cs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_229a);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0xb].fs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_229b);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0xb].gs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_229c);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0xb].tc_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_229d);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0xb].te_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_229e);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0xb].vs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_229f);
    test_cases[0xc].src_array_size = 2;
    test_cases[0xc].src_type = VARIABLE_TYPE_UVEC3;
    test_cases[0xc].dst_type = VARIABLE_TYPE_DVEC3;
    test_cases[0xc].wrap_dst_type_in_structure = false;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0xc].cs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_22a0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0xc].fs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_22a1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0xc].gs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_22a2);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0xc].tc_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_22a3);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0xc].te_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_22a4);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0xc].vs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_22a5);
    test_cases[0xd].src_array_size = 2;
    test_cases[0xd].src_type = VARIABLE_TYPE_UVEC3;
    test_cases[0xd].dst_type = VARIABLE_TYPE_DVEC3;
    test_cases[0xd].wrap_dst_type_in_structure = true;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0xd].cs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_22a6);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0xd].fs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_22a7);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0xd].gs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_22a8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0xd].tc_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_22a9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0xd].te_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_22aa);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0xd].vs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_22ab);
    test_cases[0xe].src_array_size = 2;
    test_cases[0xe].src_type = VARIABLE_TYPE_UVEC4;
    test_cases[0xe].dst_type = VARIABLE_TYPE_DVEC4;
    test_cases[0xe].wrap_dst_type_in_structure = false;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0xe].cs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_22ac);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0xe].fs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_22ad);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0xe].gs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_22ae);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0xe].tc_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_22af);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0xe].te_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_22b0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0xe].vs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_22b1);
    test_cases[0xf].src_array_size = 2;
    test_cases[0xf].src_type = VARIABLE_TYPE_UVEC4;
    test_cases[0xf].dst_type = VARIABLE_TYPE_DVEC4;
    test_cases[0xf].wrap_dst_type_in_structure = true;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0xf].cs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_22b2);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0xf].fs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_22b3);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0xf].gs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_22b4);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0xf].tc_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_22b5);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0xf].te_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_22b6);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0xf].vs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_22b7);
    test_cases[0x10].src_array_size = 2;
    test_cases[0x10].src_type = VARIABLE_TYPE_FLOAT;
    test_cases[0x10].dst_type = VARIABLE_TYPE_DOUBLE;
    test_cases[0x10].wrap_dst_type_in_structure = false;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x10].cs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_22b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x10].fs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_22b9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x10].gs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_22ba);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x10].tc_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_22bb);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x10].te_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_22bc);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x10].vs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_22bd);
    test_cases[0x11].src_array_size = 2;
    test_cases[0x11].src_type = VARIABLE_TYPE_FLOAT;
    test_cases[0x11].dst_type = VARIABLE_TYPE_DOUBLE;
    test_cases[0x11].wrap_dst_type_in_structure = true;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x11].cs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_22be);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x11].fs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_22bf);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x11].gs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_22c0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x11].tc_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_22c1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x11].te_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_22c2);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x11].vs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_22c3);
    test_cases[0x12].src_array_size = 2;
    test_cases[0x12].src_type = VARIABLE_TYPE_VEC2;
    test_cases[0x12].dst_type = VARIABLE_TYPE_DVEC2;
    test_cases[0x12].wrap_dst_type_in_structure = false;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x12].cs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_22c4);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x12].fs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_22c5);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x12].gs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_22c6);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x12].tc_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_22c7);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x12].te_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_22c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x12].vs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_22c9);
    test_cases[0x13].src_array_size = 2;
    test_cases[0x13].src_type = VARIABLE_TYPE_VEC2;
    test_cases[0x13].dst_type = VARIABLE_TYPE_DVEC2;
    test_cases[0x13].wrap_dst_type_in_structure = true;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x13].cs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_22ca);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x13].fs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_22cb);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x13].gs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_22cc);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x13].tc_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_22cd);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x13].te_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_22ce);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x13].vs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_22cf);
    test_cases[0x14].src_array_size = 2;
    test_cases[0x14].src_type = VARIABLE_TYPE_VEC3;
    test_cases[0x14].dst_type = VARIABLE_TYPE_DVEC3;
    test_cases[0x14].wrap_dst_type_in_structure = false;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x14].cs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_22d0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x14].fs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_22d1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x14].gs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_22d2);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x14].tc_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_22d3);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x14].te_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_22d4);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x14].vs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_22d5);
    test_cases[0x15].src_array_size = 2;
    test_cases[0x15].src_type = VARIABLE_TYPE_VEC3;
    test_cases[0x15].dst_type = VARIABLE_TYPE_DVEC3;
    test_cases[0x15].wrap_dst_type_in_structure = true;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x15].cs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_22d6);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x15].fs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_22d7);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x15].gs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_22d8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x15].tc_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_22d9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x15].te_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_22da);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x15].vs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_22db);
    test_cases[0x16].src_array_size = 2;
    test_cases[0x16].src_type = VARIABLE_TYPE_VEC4;
    test_cases[0x16].dst_type = VARIABLE_TYPE_DVEC4;
    test_cases[0x16].wrap_dst_type_in_structure = false;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x16].cs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_22dc);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x16].fs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_22dd);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x16].gs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_22de);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x16].tc_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_22df);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x16].te_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_22e0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x16].vs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_22e1);
    test_cases[0x17].src_array_size = 2;
    test_cases[0x17].src_type = VARIABLE_TYPE_VEC4;
    test_cases[0x17].dst_type = VARIABLE_TYPE_DVEC4;
    test_cases[0x17].wrap_dst_type_in_structure = true;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x17].cs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_22e2);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x17].fs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_22e3);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x17].gs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_22e4);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x17].tc_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_22e5);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x17].te_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_22e6);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x17].vs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_22e7);
    test_cases[0x18].src_array_size = 2;
    test_cases[0x18].src_type = VARIABLE_TYPE_MAT2;
    test_cases[0x18].dst_type = VARIABLE_TYPE_DMAT2;
    test_cases[0x18].wrap_dst_type_in_structure = false;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x18].cs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_22e8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x18].fs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_22e9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x18].gs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_22ea);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x18].tc_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_22eb);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x18].te_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_22ec);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x18].vs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_22ed);
    test_cases[0x19].src_array_size = 2;
    test_cases[0x19].src_type = VARIABLE_TYPE_MAT2;
    test_cases[0x19].dst_type = VARIABLE_TYPE_DMAT2;
    test_cases[0x19].wrap_dst_type_in_structure = true;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x19].cs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_22ee);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x19].fs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_22ef);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x19].gs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_22f0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x19].tc_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_22f1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x19].te_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_22f2);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x19].vs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_22f3);
    test_cases[0x1a].src_array_size = 2;
    test_cases[0x1a].src_type = VARIABLE_TYPE_MAT3;
    test_cases[0x1a].dst_type = VARIABLE_TYPE_DMAT3;
    test_cases[0x1a].wrap_dst_type_in_structure = false;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x1a].cs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_22f4);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x1a].fs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_22f5);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x1a].gs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_22f6);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x1a].tc_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_22f7);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x1a].te_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_22f8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x1a].vs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_22f9);
    test_cases[0x1b].src_array_size = 2;
    test_cases[0x1b].src_type = VARIABLE_TYPE_MAT3;
    test_cases[0x1b].dst_type = VARIABLE_TYPE_DMAT3;
    test_cases[0x1b].wrap_dst_type_in_structure = true;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x1b].cs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_22fa);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x1b].fs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_22fb);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x1b].gs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_22fc);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x1b].tc_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_22fd);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x1b].te_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_22fe);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x1b].vs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_22ff);
    test_cases[0x1c].src_array_size = 2;
    test_cases[0x1c].src_type = VARIABLE_TYPE_MAT4;
    test_cases[0x1c].dst_type = VARIABLE_TYPE_DMAT4;
    test_cases[0x1c].wrap_dst_type_in_structure = false;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x1c].cs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_2300);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x1c].fs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_2301);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x1c].gs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_2302);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x1c].tc_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_2303);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x1c].te_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_2304);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x1c].vs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_2305);
    test_cases[0x1d].src_array_size = 2;
    test_cases[0x1d].src_type = VARIABLE_TYPE_MAT4;
    test_cases[0x1d].dst_type = VARIABLE_TYPE_DMAT4;
    test_cases[0x1d].wrap_dst_type_in_structure = true;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x1d].cs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_2306);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x1d].fs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_2307);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x1d].gs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_2308);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x1d].tc_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_2309);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x1d].te_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_230a);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x1d].vs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_230b);
    test_cases[0x1e].src_array_size = 2;
    test_cases[0x1e].src_type = VARIABLE_TYPE_MAT2X3;
    test_cases[0x1e].dst_type = VARIABLE_TYPE_DMAT2X3;
    test_cases[0x1e].wrap_dst_type_in_structure = false;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x1e].cs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_230c);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x1e].fs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_230d);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x1e].gs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_230e);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x1e].tc_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_230f);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x1e].te_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_2310);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x1e].vs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_2311);
    test_cases[0x1f].src_array_size = 2;
    test_cases[0x1f].src_type = VARIABLE_TYPE_MAT2X3;
    test_cases[0x1f].dst_type = VARIABLE_TYPE_DMAT2X3;
    test_cases[0x1f].wrap_dst_type_in_structure = true;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x1f].cs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_2312);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x1f].fs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_2313);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x1f].gs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_2314);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x1f].tc_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_2315);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x1f].te_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_2316);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x1f].vs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_2317);
    test_cases[0x20].src_array_size = 2;
    test_cases[0x20].src_type = VARIABLE_TYPE_MAT2X4;
    test_cases[0x20].dst_type = VARIABLE_TYPE_DMAT2X4;
    test_cases[0x20].wrap_dst_type_in_structure = false;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x20].cs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_2318);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x20].fs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_2319);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x20].gs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_231a);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x20].tc_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_231b);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x20].te_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_231c);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x20].vs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_231d);
    test_cases[0x21].src_array_size = 2;
    test_cases[0x21].src_type = VARIABLE_TYPE_MAT2X4;
    test_cases[0x21].dst_type = VARIABLE_TYPE_DMAT2X4;
    test_cases[0x21].wrap_dst_type_in_structure = true;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x21].cs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_231e);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x21].fs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_231f);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x21].gs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_2320);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x21].tc_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_2321);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x21].te_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_2322);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x21].vs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_2323);
    test_cases[0x22].src_array_size = 2;
    test_cases[0x22].src_type = VARIABLE_TYPE_MAT3X2;
    test_cases[0x22].dst_type = VARIABLE_TYPE_DMAT3X2;
    test_cases[0x22].wrap_dst_type_in_structure = false;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x22].cs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_2324);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x22].fs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_2325);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x22].gs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_2326);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x22].tc_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_2327);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x22].te_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_2328);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x22].vs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_2329);
    test_cases[0x23].src_array_size = 2;
    test_cases[0x23].src_type = VARIABLE_TYPE_MAT3X2;
    test_cases[0x23].dst_type = VARIABLE_TYPE_DMAT3X2;
    test_cases[0x23].wrap_dst_type_in_structure = true;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x23].cs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_232a);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x23].fs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_232b);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x23].gs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_232c);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x23].tc_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_232d);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x23].te_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_232e);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x23].vs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_232f);
    test_cases[0x24].src_array_size = 2;
    test_cases[0x24].src_type = VARIABLE_TYPE_MAT3X4;
    test_cases[0x24].dst_type = VARIABLE_TYPE_DMAT3X4;
    test_cases[0x24].wrap_dst_type_in_structure = false;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x24].cs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_2330);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x24].fs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_2331);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x24].gs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_2332);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x24].tc_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_2333);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x24].te_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_2334);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x24].vs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_2335);
    test_cases[0x25].src_array_size = 2;
    test_cases[0x25].src_type = VARIABLE_TYPE_MAT3X4;
    test_cases[0x25].dst_type = VARIABLE_TYPE_DMAT3X4;
    test_cases[0x25].wrap_dst_type_in_structure = true;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x25].cs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_2336);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x25].fs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_2337);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x25].gs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_2338);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x25].tc_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_2339);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x25].te_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_233a);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x25].vs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_233b);
    test_cases[0x26].src_array_size = 2;
    test_cases[0x26].src_type = VARIABLE_TYPE_MAT4X2;
    test_cases[0x26].dst_type = VARIABLE_TYPE_DMAT4X2;
    test_cases[0x26].wrap_dst_type_in_structure = false;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x26].cs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_233c);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x26].fs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_233d);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x26].gs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_233e);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x26].tc_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_233f);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x26].te_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_2340);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x26].vs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_2341);
    test_cases[0x27].src_array_size = 2;
    test_cases[0x27].src_type = VARIABLE_TYPE_MAT4X2;
    test_cases[0x27].dst_type = VARIABLE_TYPE_DMAT4X2;
    test_cases[0x27].wrap_dst_type_in_structure = true;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x27].cs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_2342);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x27].fs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_2343);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x27].gs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_2344);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x27].tc_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_2345);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x27].te_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_2346);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x27].vs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_2347);
    test_cases[0x28].src_array_size = 2;
    test_cases[0x28].src_type = VARIABLE_TYPE_MAT4X3;
    test_cases[0x28].dst_type = VARIABLE_TYPE_DMAT4X3;
    test_cases[0x28].wrap_dst_type_in_structure = false;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x28].cs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_2348);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x28].fs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_2349);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x28].gs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_234a);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x28].tc_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_234b);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x28].te_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_234c);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x28].vs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_234d);
    test_cases[0x29].src_array_size = 2;
    test_cases[0x29].src_type = VARIABLE_TYPE_MAT4X3;
    test_cases[0x29].dst_type = VARIABLE_TYPE_DMAT4X3;
    test_cases[0x29].wrap_dst_type_in_structure = true;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x29].cs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_234e);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x29].fs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_234f);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x29].gs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_2350);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x29].tc_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_2351);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x29].te_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_2352);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x29].vs_shader_body,glcts::fixed_sample_locations_values + 1,
               &local_2353);
    for (lVar2 = 0; lVar2 != 0x2220; lVar2 = lVar2 + 0xd0) {
      test_case = (_test_case *)((long)&test_cases[0].src_array_size + lVar2);
      initIteration(this,test_case);
      bVar1 = executeIteration(this,test_case);
      this->m_has_test_passed = (bool)(this->m_has_test_passed & bVar1);
    }
    description = "Fail";
    if (this->m_has_test_passed != QP_TEST_RESULT_PASS) {
      description = "Pass";
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               this->m_has_test_passed ^ QP_TEST_RESULT_FAIL,description);
    lVar2 = 0x2150;
    do {
      _test_case::~_test_case((_test_case *)((long)&test_cases[0].src_array_size + lVar2));
      lVar2 = lVar2 + -0xd0;
    } while (lVar2 != -0xd0);
    return STOP;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)test_cases,"GL_ARB_gpu_shader_fp64 is not supported.",&local_2354);
  tcu::NotSupportedError::NotSupportedError(this_00,(string *)test_cases);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestNode::IterateResult GPUShaderFP64Test6::iterate()
{
	/* Do not execute the test if GL_ARB_texture_view is not supported */
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_gpu_shader_fp64"))
	{
		throw tcu::NotSupportedError("GL_ARB_gpu_shader_fp64 is not supported.");
	}

	/* Initialize GL objects needed to run the tests */
	initTest();

	/* Build iteration array to run the tests in an automated manner */
	_test_case test_cases[] = {
		/* Src array size */ /* Src type */ /* Dst type */ /* wrap_dst_type_in_structure */
		{ 2, Utils::VARIABLE_TYPE_INT, Utils::VARIABLE_TYPE_DOUBLE, false, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_INT, Utils::VARIABLE_TYPE_DOUBLE, true, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_IVEC2, Utils::VARIABLE_TYPE_DVEC2, false, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_IVEC2, Utils::VARIABLE_TYPE_DVEC2, true, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_IVEC3, Utils::VARIABLE_TYPE_DVEC3, false, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_IVEC3, Utils::VARIABLE_TYPE_DVEC3, true, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_IVEC4, Utils::VARIABLE_TYPE_DVEC4, false, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_IVEC4, Utils::VARIABLE_TYPE_DVEC4, true, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_UINT, Utils::VARIABLE_TYPE_DOUBLE, false, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_UINT, Utils::VARIABLE_TYPE_DOUBLE, true, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_UVEC2, Utils::VARIABLE_TYPE_DVEC2, false, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_UVEC2, Utils::VARIABLE_TYPE_DVEC2, true, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_UVEC3, Utils::VARIABLE_TYPE_DVEC3, false, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_UVEC3, Utils::VARIABLE_TYPE_DVEC3, true, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_UVEC4, Utils::VARIABLE_TYPE_DVEC4, false, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_UVEC4, Utils::VARIABLE_TYPE_DVEC4, true, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_FLOAT, Utils::VARIABLE_TYPE_DOUBLE, false, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_FLOAT, Utils::VARIABLE_TYPE_DOUBLE, true, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_VEC2, Utils::VARIABLE_TYPE_DVEC2, false, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_VEC2, Utils::VARIABLE_TYPE_DVEC2, true, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_VEC3, Utils::VARIABLE_TYPE_DVEC3, false, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_VEC3, Utils::VARIABLE_TYPE_DVEC3, true, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_VEC4, Utils::VARIABLE_TYPE_DVEC4, false, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_VEC4, Utils::VARIABLE_TYPE_DVEC4, true, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_MAT2, Utils::VARIABLE_TYPE_DMAT2, false, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_MAT2, Utils::VARIABLE_TYPE_DMAT2, true, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_MAT3, Utils::VARIABLE_TYPE_DMAT3, false, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_MAT3, Utils::VARIABLE_TYPE_DMAT3, true, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_MAT4, Utils::VARIABLE_TYPE_DMAT4, false, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_MAT4, Utils::VARIABLE_TYPE_DMAT4, true, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_MAT2X3, Utils::VARIABLE_TYPE_DMAT2X3, false, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_MAT2X3, Utils::VARIABLE_TYPE_DMAT2X3, true, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_MAT2X4, Utils::VARIABLE_TYPE_DMAT2X4, false, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_MAT2X4, Utils::VARIABLE_TYPE_DMAT2X4, true, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_MAT3X2, Utils::VARIABLE_TYPE_DMAT3X2, false, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_MAT3X2, Utils::VARIABLE_TYPE_DMAT3X2, true, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_MAT3X4, Utils::VARIABLE_TYPE_DMAT3X4, false, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_MAT3X4, Utils::VARIABLE_TYPE_DMAT3X4, true, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_MAT4X2, Utils::VARIABLE_TYPE_DMAT4X2, false, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_MAT4X2, Utils::VARIABLE_TYPE_DMAT4X2, true, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_MAT4X3, Utils::VARIABLE_TYPE_DMAT4X3, false, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_MAT4X3, Utils::VARIABLE_TYPE_DMAT4X3, true, "", "", "", "", "", "" }
	};
	const unsigned int n_test_cases = sizeof(test_cases) / sizeof(test_cases[0]);

	/* Execute all iterations */
	for (unsigned int n_test_case = 0; n_test_case < n_test_cases; ++n_test_case)
	{
		_test_case& test_case = test_cases[n_test_case];

		/* Initialize a program object we will use to perform the casting */
		initIteration(test_case);

		/* Use the program object to XFB the results */
		m_has_test_passed &= executeIteration(test_case);

	} /* for (all test cases) */

	/* We're done */
	if (m_has_test_passed)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}